

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

int ON_InsertKnot(double knot_value,int knot_multiplicity,int cv_dim,int order,int cv_count,
                 int cv_stride,double *cv,double *knot,int *hint)

{
  size_t __n;
  double dVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  void *pvVar8;
  double *pdVar9;
  int iVar10;
  char *pcVar11;
  double *__dest;
  ulong uVar12;
  double *pdVar13;
  void *pvVar14;
  uint uVar15;
  double *pdVar16;
  long lVar17;
  void *pvVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  double *__src;
  ulong uVar23;
  void *pvVar24;
  void *pvVar25;
  void *pvVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  ulong uVar22;
  
  if ((order < 2) || (cv_count < order || knot == (double *)0x0)) {
    pcVar11 = "ON_InsertKnot(): illegal input";
    iVar3 = 0x521;
  }
  else {
    uVar23 = (ulong)(uint)knot_multiplicity;
    if ((cv == (double *)0x0) || (0 < cv_dim && cv_dim <= cv_stride)) {
      if (knot_multiplicity < order) {
        if (hint == (int *)0x0) {
          iVar3 = 0;
        }
        else {
          iVar3 = *hint;
        }
        iVar3 = ON_NurbsSpanIndex(order,cv_count,knot,knot_value,1,iVar3);
        __src = knot + iVar3;
        __dest = cv + iVar3 * cv_stride;
        if (cv == (double *)0x0) {
          __dest = (double *)0x0;
        }
        uVar12 = (ulong)(uint)order;
        dVar28 = __src[uVar12 - 2];
        dVar1 = __src[uVar12 - 1];
        if ((dVar28 != dVar1) || (dVar27 = 0.0, NAN(dVar28) || NAN(dVar1))) {
          dVar28 = (ABS(dVar28 - dVar1) + ABS(dVar1) + ABS(dVar28)) * 1.490116119385e-08;
          dVar27 = 2.220446049250313e-16;
          if (2.220446049250313e-16 <= dVar28) {
            dVar27 = dVar28;
          }
        }
        if (((iVar3 != 0) || (__src[uVar12 - 1] <= knot_value)) ||
           (__src[uVar12 - 2] + dVar27 < knot_value)) {
          iVar10 = cv_count - iVar3;
          if (((iVar3 != iVar10 - order) ||
              (knot_value < __src[uVar12 - 2] || knot_value == __src[uVar12 - 2])) ||
             (knot_value < __src[uVar12 - 1] - dVar27)) {
            uVar4 = (ulong)(order - 2U);
            dVar28 = __src[uVar4];
            uVar21 = order - 1;
            uVar22 = (ulong)uVar21;
            dVar1 = __src[uVar22];
            if ((((dVar28 + dVar1) * 0.5 < knot_value) ||
                (dVar29 = dVar28, dVar27 < ABS(knot_value - dVar28))) &&
               (dVar29 = knot_value, ABS(knot_value - dVar1) <= dVar27)) {
              dVar29 = dVar1;
            }
            if ((dVar29 != dVar28) || (NAN(dVar29) || NAN(dVar28))) {
              if (knot_multiplicity < 1 || dVar29 != dVar1) {
                uVar7 = 0;
              }
              else {
                uVar6 = 0;
                do {
                  uVar7 = uVar6;
                  if ((__src[(long)(int)uVar21 + uVar6] != dVar29) ||
                     (NAN(__src[(long)(int)uVar21 + uVar6]) || NAN(dVar29))) break;
                  uVar6 = uVar6 + 1;
                  uVar7 = uVar23;
                } while (uVar23 != uVar6);
              }
            }
            else if (knot_multiplicity < 1) {
              uVar7 = 0;
            }
            else {
              lVar5 = 0;
              do {
                if ((knot[(long)iVar3 + (int)(order - 2U) + lVar5] != dVar29) ||
                   (NAN(knot[(long)iVar3 + (int)(order - 2U) + lVar5]) || NAN(dVar29))) {
                  uVar7 = (ulong)(uint)-(int)lVar5;
                  break;
                }
                lVar5 = lVar5 + -1;
                uVar7 = uVar23;
              } while (uVar23 + lVar5 != 0);
            }
            iVar19 = knot_multiplicity - (int)uVar7;
            if (hint != (int *)0x0) {
              *hint = iVar3 + iVar19;
            }
            if (iVar19 < 1) {
              return 0;
            }
            uVar15 = iVar19 + uVar21 * 2;
            pvVar8 = onmalloc((long)(int)((iVar19 + order) * cv_dim + uVar15) << 3);
            if (pvVar8 != (void *)0x0) {
              memcpy(pvVar8,__src,(ulong)(uVar21 * 2) * 8);
              lVar17 = (long)cv_dim;
              lVar5 = (long)cv_stride;
              if (__dest == (double *)0x0) {
                pvVar24 = (void *)0x0;
              }
              else {
                pvVar24 = (void *)((long)pvVar8 + (ulong)uVar15 * 8);
                uVar23 = 1;
                if (1 < order) {
                  uVar23 = (ulong)(uint)order;
                }
                pdVar16 = __dest;
                pvVar25 = pvVar24;
                do {
                  memcpy(pvVar25,pdVar16,lVar17 * 8);
                  pdVar16 = pdVar16 + lVar5;
                  pvVar25 = (void *)((long)pvVar25 + lVar17 * 8);
                  uVar23 = uVar23 - 1;
                } while (uVar23 != 0);
              }
              uVar23 = 0;
              pdVar16 = __src + uVar22;
              __n = lVar17 * 8;
              do {
                if ((dVar29 < *(double *)((long)pvVar8 + uVar12 * 8 + -0x10)) ||
                   (*(double *)((long)pvVar8 + uVar22 * 8) <= dVar29)) {
                  pcVar11 = "ON_InsertSingleKnot() - illegal knot input";
                  iVar19 = 0x4cb;
LAB_004c3799:
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                             ,iVar19,"",pcVar11);
                  break;
                }
                if ((cv_dim < 1) && (pvVar24 != (void *)0x0)) {
                  pcVar11 = "ON_InsertSingleKnot() - illegal cv input";
                  iVar19 = 0x4d1;
                  goto LAB_004c3799;
                }
                pdVar9 = (double *)((long)pvVar8 + (ulong)(uVar21 * 2) * 8);
                uVar6 = uVar22;
                uVar15 = uVar21;
                while (uVar15 != 0) {
                  *pdVar9 = pdVar9[-1];
                  uVar15 = (int)uVar6 - 1;
                  uVar6 = (ulong)uVar15;
                  pdVar9 = pdVar9 + -1;
                }
                *pdVar9 = dVar29;
                if (pvVar24 != (void *)0x0) {
                  pvVar25 = (void *)((long)pvVar24 + (long)(order * cv_dim) * 8);
                  memcpy(pvVar25,(void *)((long)pvVar24 + (long)(int)(uVar21 * cv_dim) * 8),__n);
                  pdVar9 = (double *)((long)pvVar8 + uVar22 * 8 + -8);
                  pdVar13 = (double *)((long)pvVar8 + uVar12 * 8 + uVar22 * 8 + -8);
                  pvVar18 = (void *)((long)pvVar25 + lVar17 * -8);
                  uVar6 = uVar4;
                  uVar15 = uVar21;
                  if (dVar29 - *(double *)((long)pvVar8 + uVar22 * 8 + -8) <= *pdVar13 - dVar29) {
                    while (uVar15 != 0) {
                      if (cv_dim != 0) {
                        dVar28 = (dVar29 - *pdVar9) / (*pdVar13 - *pdVar9);
                        pvVar14 = pvVar18;
                        pvVar26 = pvVar25;
                        iVar20 = cv_dim;
                        do {
                          pvVar25 = (void *)((long)pvVar26 + -8);
                          pvVar18 = (void *)((long)pvVar14 + -8);
                          *(double *)((long)pvVar26 + -8) =
                               *(double *)((long)pvVar26 + -8) * dVar28 +
                               *(double *)((long)pvVar14 + -8) * (1.0 - dVar28);
                          iVar20 = iVar20 + -1;
                          pvVar14 = pvVar18;
                          pvVar26 = pvVar25;
                        } while (iVar20 != 0);
                      }
                      pdVar9 = pdVar9 + -1;
                      pdVar13 = pdVar13 + -1;
                      uVar15 = (uint)uVar6;
                      uVar6 = (ulong)(uVar15 - 1);
                    }
                  }
                  else {
                    while (uVar15 != 0) {
                      if (cv_dim != 0) {
                        dVar28 = (*pdVar13 - dVar29) / (*pdVar13 - *pdVar9);
                        pvVar14 = pvVar18;
                        pvVar26 = pvVar25;
                        iVar20 = cv_dim;
                        do {
                          pvVar25 = (void *)((long)pvVar26 + -8);
                          pvVar18 = (void *)((long)pvVar14 + -8);
                          *(double *)((long)pvVar26 + -8) =
                               *(double *)((long)pvVar26 + -8) * (1.0 - dVar28) +
                               *(double *)((long)pvVar14 + -8) * dVar28;
                          iVar20 = iVar20 + -1;
                          pvVar14 = pvVar18;
                          pvVar26 = pvVar25;
                        } while (iVar20 != 0);
                      }
                      pdVar9 = pdVar9 + -1;
                      pdVar13 = pdVar13 + -1;
                      uVar15 = (uint)uVar6;
                      uVar6 = (ulong)(uVar15 - 1);
                    }
                  }
                }
                if (pvVar24 != (void *)0x0) {
                  pvVar24 = (void *)((long)pvVar24 + lVar5 * 8);
                }
                pvVar8 = (void *)((long)pvVar8 + 8);
                uVar23 = (ulong)((int)uVar23 + 1);
                bVar2 = 1 < iVar19;
                iVar19 = iVar19 + -1;
              } while (bVar2);
              iVar19 = (int)uVar23;
              pvVar8 = (void *)((long)pvVar8 + uVar23 * -8);
              if (iVar19 != 0) {
                if (iVar10 != order) {
                  iVar20 = (iVar3 + order) - cv_count;
                  do {
                    __src[iVar19 + -3 + iVar10 + order] = __src[iVar10 + order + -3];
                    __src = __src + -1;
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != 0);
                }
                memcpy(pdVar16,(void *)((long)pvVar8 + uVar22 * 8),(ulong)(uVar21 + iVar19) << 3);
                if (__dest != (double *)0x0) {
                  if (iVar10 != order) {
                    iVar10 = (iVar10 + -1) * cv_stride;
                    iVar20 = iVar19 * cv_stride + iVar10;
                    iVar3 = (iVar3 + order) - cv_count;
                    do {
                      memcpy(__dest + iVar20,__dest + iVar10,__n);
                      iVar20 = iVar20 - cv_stride;
                      iVar10 = iVar10 - cv_stride;
                      iVar3 = iVar3 + 1;
                    } while (iVar3 != 0);
                  }
                  iVar3 = order + iVar19;
                  if (iVar3 != 0 && SCARRY4(order,iVar19) == iVar3 < 0) {
                    pvVar24 = (void *)((long)pvVar24 + (long)(iVar19 * cv_stride) * -8);
                    do {
                      memcpy(__dest,pvVar24,__n);
                      pvVar24 = (void *)((long)pvVar24 + __n);
                      __dest = __dest + lVar5;
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                  }
                }
              }
              onfree(pvVar8);
              return iVar19;
            }
            pcVar11 = "ON_InsertKnot(): out of memory";
            iVar3 = 0x570;
          }
          else {
            pcVar11 = "ON_InsertKnot(): requested knot_value at end of NURBS domain";
            iVar3 = 0x54d;
          }
        }
        else {
          pcVar11 = "ON_InsertKnot(): requested knot_value at start of NURBS domain";
          iVar3 = 0x544;
        }
      }
      else {
        pcVar11 = "ON_InsertKnot(): requested knot_multiplicity > degree";
        iVar3 = 0x530;
      }
    }
    else {
      pcVar11 = "ON_InsertKnot(): illegal input";
      iVar3 = 0x529;
    }
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
             ,iVar3,"",pcVar11);
  return 0;
}

Assistant:

int ON_InsertKnot( 
        double knot_value, 
        int knot_multiplicity, 
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int* hint     // optional hint about where to search for span to add knots to
                      // pass nullptr if no hint is available
        )
{
  int rc = 0; // return code = number of knots added

  if ( order < 2 || cv_count < order || !knot ) 
  {
    ON_ERROR("ON_InsertKnot(): illegal input" );
    return 0;
  }

  if ( cv ) 
  {
    if ( cv_dim < 1 || cv_stride < cv_dim ) 
    {
      ON_ERROR("ON_InsertKnot(): illegal input" );
      return 0;
    }
  }

  if ( knot_multiplicity >= order ) 
  {
    ON_ERROR("ON_InsertKnot(): requested knot_multiplicity > degree" );
    return 0;
  }

  // shift knot vector and cv array so that knot_value lies in first span
  int span_index = ON_NurbsSpanIndex( order, cv_count, knot, knot_value, 1, hint?*hint:0 );
  knot += span_index;
  if ( cv )
    cv += (span_index*cv_stride);
  cv_count -= span_index;

  const double knot_tolerance = ON_SpanTolerance( order, cv_count, knot, 0 );

  // check that knot_value is interior to NURBS domain
  if ( span_index == 0 ) 
  {
    if ( knot_value < knot[order-1] ) 
    {
      if ( knot_value <= knot[order-2] + knot_tolerance ) 
      {
        ON_ERROR("ON_InsertKnot(): requested knot_value at start of NURBS domain" );
        return 0;
      }
    }
  }
  if ( span_index == cv_count-order ) 
  {
    if ( knot_value > knot[order-2] && knot_value >= knot[order-1] - knot_tolerance ) 
    {
      ON_ERROR("ON_InsertKnot(): requested knot_value at end of NURBS domain" );
      return 0;
    }
  }

  // if knot_value is nearly equal to an existing knot, make it exactly equal
  if ( knot_value <= 0.5*(knot[order-2]+knot[order-1]) && fabs( knot_value - knot[order-2] ) <= knot_tolerance ) {
    knot_value = knot[order-2];
  }
  else if ( fabs( knot_value - knot[order-1] ) <= knot_tolerance ) {
    knot_value = knot[order-1];
  }

  const int degree = order-1;

  // set m = number of knots to add
  int m = 0; 
  int j;
  if ( knot_value == knot[order-2] ) {
    for ( j = order-2; m < knot_multiplicity && knot[j-m] == knot_value; m++ )
      ; // empty for
  }
  else if ( knot_value == knot[order-1] ) {
    for ( j = order-1; m < knot_multiplicity && knot[j+m] == knot_value; m++ )
      ; // empty for
  }
  m = knot_multiplicity - m;
  if ( hint )
    *hint = span_index+m;

  if ( m <= 0 )
    return 0; // no knots need to be added

  double* new_knot = (double*)onmalloc( ((2*degree+m) + (order+m)*cv_dim)*sizeof(*new_knot) );
  if ( !new_knot ) {
    ON_ERROR("ON_InsertKnot(): out of memory");
    return 0;
  }
  double* new_cv = 0;
  memcpy( new_knot, knot, 2*degree*sizeof(*new_knot) );
  if ( cv ) {
    new_cv = new_knot + (2*degree+m);
    for ( j = 0; j < order; j++ ) {
      memcpy( new_cv + j*cv_dim, cv + j*cv_stride, cv_dim*sizeof(*new_cv) );
    }
  }

  // add m more knots at knot_value
  rc = 0;
  while (m>0) {
    if ( !ON_InsertSingleKnot(cv_dim,order,cv_dim,new_cv,new_knot,knot_value) )
      break;
    m--;
    if ( new_cv )
      new_cv += cv_stride; 
    new_knot++; 
    rc++;
  }
  new_knot -= rc;
  new_cv -= rc*cv_stride;

  if ( rc > 0 ) 
  {
    // make room for rc many new knots
    int i0 = ON_KnotCount( order, cv_count ) - 1; // knot[i0] = last input knot
    int i1 = i0 + rc;
    int j_local  = (cv_count-order);
    while (j_local--)
      knot[i1--] = knot[i0--];
    
    // update knot vector
    memcpy ( knot+degree, new_knot+degree, (degree+rc)*sizeof(*new_knot) );

    if ( cv ) {
      // make room for rc many new CVs
      i0 = (cv_count-1)*cv_stride;             // cv[i0] = last coord of last input cv */
      i1 = i0 + rc*cv_stride;
      j_local = cv_count-order;
      while (j_local--) {
        memcpy( cv+i1, cv+i0, cv_dim*sizeof(*cv) );
        i1 -= cv_stride;
        i0 -= cv_stride;
      }

      // update cv values
      for ( j_local = 0; j_local < order+rc; j_local++ ) {
        memcpy( cv, new_cv, cv_dim*sizeof(*new_cv) );
        cv += cv_stride;
        new_cv += cv_dim;
      }
    }

  }

  onfree(new_knot);

  return rc;
}